

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O2

void __thiscall Noise::Noise(Noise *this,Noise *noise)

{
  Time *time;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  time = (noise->super_StochasticVariable).super_StochasticProcess.super_TimeDependent.xTime;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Stochastic Variable",&local_52);
  StochasticVariable::StochasticVariable(&this->super_StochasticVariable,time,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__WienerNoise_00155e98;
  (this->super_StochasticVariable).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__Noise_00155f48;
  (this->super_StochasticVariable).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__Noise_00155f90;
  return;
}

Assistant:

Noise::Noise( const Noise &noise)
	: StochasticVariable(noise.xTime)
{}